

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::Option::_reduce_results(Option *this,results_t *out,results_t *original)

{
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ArgumentMismatch *pAVar8;
  string *psVar9;
  long lVar10;
  pointer pbVar11;
  ulong uVar12;
  int num;
  pointer pbVar13;
  int iVar14;
  string sStack_a8;
  undefined1 local_88 [17];
  undefined1 local_77;
  string local_68;
  string local_48;
  
  psVar9 = &sStack_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(out);
  switch((this->super_OptionBase<CLI::Option>).multi_option_policy_) {
  case TakeLast:
    uVar5 = get_items_expected_max(this);
    uVar12 = 1;
    if (1 < (int)uVar5) {
      uVar12 = (ulong)uVar5;
    }
    pbVar11 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar11 -
                (long)(original->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar12) break;
    pbVar13 = pbVar11 + -uVar12;
    goto LAB_001736a3;
  case TakeFirst:
    uVar5 = get_items_expected_max(this);
    uVar12 = 1;
    if (1 < (int)uVar5) {
      uVar12 = (ulong)uVar5;
    }
    pbVar13 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(original->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 >> 5) <= uVar12)
    break;
    pbVar11 = pbVar13 + uVar12;
LAB_001736a3:
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,pbVar13,
               pbVar11);
    break;
  case Join:
    if ((ulong)((long)(this->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->results_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) break;
    bVar1 = (this->super_OptionBase<CLI::Option>).delimiter_;
    psVar9 = (string *)0xa;
    if (bVar1 != 0) {
      psVar9 = (string *)(ulong)bVar1;
    }
    local_88._0_8_ = local_88 + 0x10;
    local_88[0x10] = SUB81(psVar9,0);
    local_88._8_8_ = (pointer)0x1;
    local_77 = 0;
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&sStack_a8,(detail *)original,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88,psVar9);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,&sStack_a8);
    ::std::__cxx11::string::~string((string *)&sStack_a8);
    psVar9 = (string *)local_88;
    goto LAB_00173713;
  case TakeAll:
    break;
  case Sum:
    detail::sum_string_vector(&sStack_a8,original);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,&sStack_a8);
LAB_00173713:
    ::std::__cxx11::string::~string((string *)psVar9);
    break;
  case Reverse:
    uVar5 = get_items_expected_max(this);
    uVar12 = 1;
    if (1 < (int)uVar5) {
      uVar12 = (ulong)uVar5;
    }
    pbVar13 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (long)pbVar13 -
            (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    uVar7 = uVar6;
    if (uVar12 <= uVar6) {
      uVar7 = uVar12;
    }
    if (uVar12 < uVar6 || 1 < uVar7) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
                 pbVar13 + -uVar7);
    }
    ::std::
    __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((out->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (out->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    break;
  default:
    iVar14 = this->expected_min_ * this->type_size_min_;
    uVar5 = get_items_expected_max(this);
    iVar14 = iVar14 + (uint)(iVar14 == 0);
    num = uVar5 + (uVar5 == 0);
    pbVar13 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar10 = (long)(original->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13;
    uVar12 = lVar10 >> 5;
    if (uVar12 < (ulong)(long)iVar14) {
      pAVar8 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_48,this,false,false);
      ArgumentMismatch::AtLeast
                (pAVar8,&local_48,iVar14,
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
      __cxa_throw(pAVar8,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    if ((ulong)(long)num < uVar12) {
      if ((((1 < uVar5) || (lVar10 != 0x40)) ||
          (bVar4 = ::std::operator==(pbVar13 + 1,"%%"), !bVar4)) ||
         (bVar4 = ::std::operator==((original->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start,"{}"), !bVar4)) {
        pAVar8 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        get_name_abi_cxx11_(&local_68,this,false,false);
        ArgumentMismatch::AtMost
                  (pAVar8,&local_68,num,
                   (long)(original->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(original->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5);
        __cxa_throw(pAVar8,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(out,original);
    }
  }
  pbVar2 = (out->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (out->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar3) {
    pbVar2 = (original->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 != 0x20) {
      return;
    }
    bVar4 = ::std::operator==(pbVar2,"{}");
    if (!bVar4) {
      return;
    }
    if (this->expected_min_ * this->type_size_min_ < 1) {
      return;
    }
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
               (char (*) [3])0x3424ae);
  }
  else {
    if ((long)pbVar3 - (long)pbVar2 != 0x20) {
      return;
    }
    bVar4 = ::std::operator==(pbVar2,"{}");
    if (!bVar4) {
      return;
    }
    if (this->expected_min_ * this->type_size_min_ < 1) {
      return;
    }
  }
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,
             (char (*) [3])"%%");
  return;
}

Assistant:

CLI11_INLINE void Option::_reduce_results(results_t &out, const results_t &original) const {

    // max num items expected or length of vector, always at least 1
    // Only valid for a trimming policy

    out.clear();
    // Operation depends on the policy setting
    switch(multi_option_policy_) {
    case MultiOptionPolicy::TakeAll:
        break;
    case MultiOptionPolicy::TakeLast: {
        // Allow multi-option sizes (including 0)
        std::size_t trim_size = std::min<std::size_t>(
            static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
        if(original.size() != trim_size) {
            out.assign(original.end() - static_cast<results_t::difference_type>(trim_size), original.end());
        }
    } break;
    case MultiOptionPolicy::Reverse: {
        // Allow multi-option sizes (including 0)
        std::size_t trim_size = std::min<std::size_t>(
            static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
        if(original.size() != trim_size || trim_size > 1) {
            out.assign(original.end() - static_cast<results_t::difference_type>(trim_size), original.end());
        }
        std::reverse(out.begin(), out.end());
    } break;
    case MultiOptionPolicy::TakeFirst: {
        std::size_t trim_size = std::min<std::size_t>(
            static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
        if(original.size() != trim_size) {
            out.assign(original.begin(), original.begin() + static_cast<results_t::difference_type>(trim_size));
        }
    } break;
    case MultiOptionPolicy::Join:
        if(results_.size() > 1) {
            out.push_back(detail::join(original, std::string(1, (delimiter_ == '\0') ? '\n' : delimiter_)));
        }
        break;
    case MultiOptionPolicy::Sum:
        out.push_back(detail::sum_string_vector(original));
        break;
    case MultiOptionPolicy::Throw:
    default: {
        auto num_min = static_cast<std::size_t>(get_items_expected_min());
        auto num_max = static_cast<std::size_t>(get_items_expected_max());
        if(num_min == 0) {
            num_min = 1;
        }
        if(num_max == 0) {
            num_max = 1;
        }
        if(original.size() < num_min) {
            throw ArgumentMismatch::AtLeast(get_name(), static_cast<int>(num_min), original.size());
        }
        if(original.size() > num_max) {
            if(original.size() == 2 && num_max == 1 && original[1] == "%%" && original[0] == "{}") {
                // this condition is a trap for the following empty indicator check on config files
                out = original;
            } else {
                throw ArgumentMismatch::AtMost(get_name(), static_cast<int>(num_max), original.size());
            }
        }
        break;
    }
    }
    // this check is to allow an empty vector in certain circumstances but not if expected is not zero.
    // {} is the indicator for an empty container
    if(out.empty()) {
        if(original.size() == 1 && original[0] == "{}" && get_items_expected_min() > 0) {
            out.emplace_back("{}");
            out.emplace_back("%%");
        }
    } else if(out.size() == 1 && out[0] == "{}" && get_items_expected_min() > 0) {
        out.emplace_back("%%");
    }
}